

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::generateID(QPDFWriter *this)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  runtime_error *this_00;
  time_t __val;
  reference ppVar4;
  char *str;
  element_type *peVar5;
  uchar *in_RCX;
  allocator *md;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  size_t n_00;
  string *key;
  string *d;
  string local_1b0;
  allocator local_189;
  string local_188 [32];
  uchar local_168 [8];
  Digest digest;
  undefined1 local_150 [8];
  MD5 m;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *item;
  iterator __end3;
  iterator __begin3;
  string local_100 [32];
  QPDFObjectHandle local_e0;
  Dictionary local_d0;
  Dictionary *local_c0;
  Dictionary *__range3;
  string local_b0;
  string local_90;
  string local_70 [8];
  string seed;
  string local_40 [8];
  string result;
  QPDFObjectHandle trailer;
  QPDFWriter *this_local;
  
  std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    QPDF::getTrailer((QPDF *)((long)&result.field_2 + 8));
    std::__cxx11::string::string(local_40);
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar3->static_id & 1U) == 0) {
      std::__cxx11::string::string(local_70);
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar3->deterministic_id & 1U) == 0) {
        __val = QUtil::get_current_time();
        std::__cxx11::to_string(&local_90,__val);
        std::__cxx11::string::operator+=(local_70,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::__cxx11::string::operator+=(local_70,peVar3->filename);
        std::__cxx11::string::operator+=(local_70," ");
      }
      else {
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          QTC::TC("qpdf","QPDFWriter deterministic with no data",0);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,
                     "INTERNAL ERROR: QPDFWriter::generateID has no data for deterministic ID.  This may happen if deterministic ID and file encryption are requested together."
                    );
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::__cxx11::string::operator+=(local_70,(string *)&peVar3->deterministic_id_data);
      }
      std::__cxx11::string::operator+=(local_70," QPDF ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"/Info",(allocator<char> *)((long)&__range3 + 7));
      key = &local_b0;
      bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)((long)&result.field_2 + 8),key);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      n = extraout_RDX;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_100,"/Info",(allocator<char> *)((long)&__begin3._M_node + 7));
        QPDFObjectHandle::getKey(&local_e0,(string *)((long)&result.field_2 + 8));
        QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&local_d0,(typed)&local_e0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__begin3._M_node + 7));
        local_c0 = &local_d0;
        __end3 = ::qpdf::BaseDictionary::begin_abi_cxx11_(&local_c0->super_BaseDictionary);
        item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                *)::qpdf::BaseDictionary::end_abi_cxx11_(&local_c0->super_BaseDictionary);
        while( true ) {
          key = (string *)&item;
          bVar1 = std::operator!=(&__end3,(_Self *)key);
          if (!bVar1) break;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                   ::operator*(&__end3);
          bVar1 = QPDFObjectHandle::isString(&ppVar4->second);
          if (bVar1) {
            std::__cxx11::string::operator+=(local_70," ");
            QPDFObjectHandle::getStringValue_abi_cxx11_
                      ((string *)
                       &m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&ppVar4->second);
            std::__cxx11::string::operator+=
                      (local_70,(string *)
                                &m.crypto.
                                 super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
            std::__cxx11::string::~string
                      ((string *)
                       &m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
          ::operator++(&__end3);
        }
        ::qpdf::Dictionary::~Dictionary(&local_d0);
        n = extraout_RDX_00;
      }
      MD5::MD5((MD5 *)local_150,(uchar *)key,n,in_RCX);
      str = (char *)std::__cxx11::string::c_str();
      MD5::encodeString((MD5 *)local_150,str);
      MD5::digest((MD5 *)local_150,local_168);
      md = &local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,(char *)local_168,0x10,md);
      d = local_188;
      std::__cxx11::string::operator=(local_40,d);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      MD5::~MD5((MD5 *)local_150,(uchar *)d,n_00,(uchar *)md);
      std::__cxx11::string::~string(local_70);
    }
    else {
      std::__cxx11::string::operator=(local_40,(char *)generateID::tmp);
    }
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=((string *)&peVar3->id2,local_40);
    getOriginalID1_abi_cxx11_(&local_1b0,this);
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=((string *)&peVar3->id1,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar5 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::__cxx11::string::operator=((string *)&peVar5->id1,(string *)&peVar3->id2);
    }
    std::__cxx11::string::~string(local_40);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&result.field_2 + 8));
  }
  return;
}

Assistant:

void
QPDFWriter::generateID()
{
    // Generate the ID lazily so that we can handle the user's preference to use static or
    // deterministic ID generation.

    if (!m->id2.empty()) {
        return;
    }

    QPDFObjectHandle trailer = m->pdf.getTrailer();

    std::string result;

    if (m->static_id) {
        // For test suite use only...
        static unsigned char tmp[] = {
            0x31,
            0x41,
            0x59,
            0x26,
            0x53,
            0x58,
            0x97,
            0x93,
            0x23,
            0x84,
            0x62,
            0x64,
            0x33,
            0x83,
            0x27,
            0x95,
            0x00};
        result = reinterpret_cast<char*>(tmp);
    } else {
        // The PDF specification has guidelines for creating IDs, but it states clearly that the
        // only thing that's really important is that it is very likely to be unique.  We can't
        // really follow the guidelines in the spec exactly because we haven't written the file yet.
        // This scheme should be fine though.  The deterministic ID case uses a digest of a
        // sufficient portion of the file's contents such no two non-matching files would match in
        // the subsets used for this computation.  Note that we explicitly omit the filename from
        // the digest calculation for deterministic ID so that the same file converted with qpdf, in
        // that case, would have the same ID regardless of the output file's name.

        std::string seed;
        if (m->deterministic_id) {
            if (m->deterministic_id_data.empty()) {
                QTC::TC("qpdf", "QPDFWriter deterministic with no data");
                throw std::runtime_error(
                    "INTERNAL ERROR: QPDFWriter::generateID has no data for "
                    "deterministic ID.  This may happen if deterministic ID "
                    "and file encryption are requested together.");
            }
            seed += m->deterministic_id_data;
        } else {
            seed += std::to_string(QUtil::get_current_time());
            seed += m->filename;
            seed += " ";
        }
        seed += " QPDF ";
        if (trailer.hasKey("/Info")) {
            for (auto const& item: trailer.getKey("/Info").as_dictionary()) {
                if (item.second.isString()) {
                    seed += " ";
                    seed += item.second.getStringValue();
                }
            }
        }

        MD5 m;
        m.encodeString(seed.c_str());
        MD5::Digest digest;
        m.digest(digest);
        result = std::string(reinterpret_cast<char*>(digest), sizeof(MD5::Digest));
    }

    // If /ID already exists, follow the spec: use the original first word and generate a new second
    // word.  Otherwise, we'll use the generated ID for both.

    m->id2 = result;
    // Note: keep /ID from old file even if --static-id was given.
    m->id1 = getOriginalID1();
    if (m->id1.empty()) {
        m->id1 = m->id2;
    }
}